

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utypes.h
# Opt level: O2

MeasureUnit * icu_63::MeasureUnit::create(int typeId,int subTypeId,UErrorCode *status)

{
  MeasureUnit *pMVar1;
  undefined4 in_register_00000034;
  
  if (U_ZERO_ERROR < *status) {
    return (MeasureUnit *)0x0;
  }
  pMVar1 = (MeasureUnit *)
           UMemory::operator_new((UMemory *)0x18,CONCAT44(in_register_00000034,subTypeId));
  if (pMVar1 == (MeasureUnit *)0x0) {
    *status = U_MEMORY_ALLOCATION_ERROR;
    pMVar1 = (MeasureUnit *)0x0;
  }
  else {
    (pMVar1->super_UObject)._vptr_UObject = (_func_int **)&PTR__MeasureUnit_00463cf0;
    pMVar1->fTypeId = typeId;
    pMVar1->fSubTypeId = subTypeId;
    pMVar1->fCurrency[0] = '\0';
  }
  return pMVar1;
}

Assistant:

static
    inline UBool U_FAILURE(UErrorCode code) { return (UBool)(code>U_ZERO_ERROR); }